

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::visitEnumDecl(CheckerVisitor *this,EnumDecl *enm)

{
  bool bVar1;
  SymbolInfo *pSVar2;
  ValueRef *pVVar3;
  ArenaVector<SQCompilation::EnumConst> *this_00;
  Arena *pAVar4;
  EnumDecl *in_RSI;
  CheckerVisitor *in_RDI;
  SQChar *fqn;
  ValueRef *cv;
  SymbolInfo *constInfo;
  EnumConst *c;
  iterator __end1;
  iterator __begin1;
  ArenaVector<SQCompilation::EnumConst> *__range1;
  ValueRef *ev;
  SymbolInfo *info;
  SQChar *in_stack_ffffffffffffff98;
  CheckerVisitor *in_stack_ffffffffffffffa8;
  CheckerVisitor *in_stack_ffffffffffffffb0;
  Arena *arena;
  Arena *local_30;
  
  bVar1 = EnumDecl::isGlobal(in_RSI);
  if (bVar1) {
    EnumDecl::name(in_RSI);
    storeGlobalDeclaration(in_RDI,in_stack_ffffffffffffff98,(Node *)0x196fd4);
  }
  pSVar2 = makeSymbolInfo(in_stack_ffffffffffffffb0,
                          (SymbolKind)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  pVVar3 = makeValueRef(in_stack_ffffffffffffffb0,(SymbolInfo *)in_stack_ffffffffffffffa8);
  pVVar3->state = VRS_DECLARED;
  pVVar3->expression = (Expr *)0x0;
  (pSVar2->declarator).e = in_RSI;
  pSVar2->ownedScope = in_RDI->currentScope;
  bVar1 = EnumDecl::isGlobal(in_RSI);
  pSVar2->used = bVar1;
  EnumDecl::name(in_RSI);
  declareSymbol(in_stack_ffffffffffffffb0,(SQChar *)in_stack_ffffffffffffffa8,(ValueRef *)in_RDI);
  this_00 = EnumDecl::consts(in_RSI);
  local_30 = (Arena *)ArenaVector<SQCompilation::EnumConst>::begin(this_00);
  pAVar4 = (Arena *)ArenaVector<SQCompilation::EnumConst>::end(this_00);
  for (; local_30 != pAVar4; local_30 = (Arena *)&local_30->_bigChunks) {
    arena = local_30;
    pSVar2 = makeSymbolInfo(in_stack_ffffffffffffffb0,
                            (SymbolKind)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    in_stack_ffffffffffffffb0 =
         (CheckerVisitor *)
         makeValueRef(in_stack_ffffffffffffffb0,(SymbolInfo *)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb0->functionComplexityThreshold = VRS_INITIALIZED;
    *(LiteralExpr **)&in_stack_ffffffffffffffb0->statementSimilarityThreshold =
         *(LiteralExpr **)&arena->_alloc_ctx;
    (pSVar2->declarator).x = (Id *)arena;
    pSVar2->ownedScope = in_RDI->currentScope;
    bVar1 = EnumDecl::isGlobal(in_RSI);
    pSVar2->used = bVar1;
    EnumDecl::name(in_RSI);
    in_stack_ffffffffffffffa8 =
         (CheckerVisitor *)enumFqn(arena,(SQChar *)pSVar2,(SQChar *)in_stack_ffffffffffffffb0);
    declareSymbol(in_stack_ffffffffffffffb0,(SQChar *)in_stack_ffffffffffffffa8,(ValueRef *)in_RDI);
    Node::visit<SQCompilation::CheckerVisitor>
              ((Node *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void CheckerVisitor::visitEnumDecl(EnumDecl *enm) {

  if (enm->isGlobal()) {
    storeGlobalDeclaration(enm->name(), enm);
  }

  SymbolInfo *info = makeSymbolInfo(SK_ENUM);
  ValueRef *ev = makeValueRef(info);
  ev->state = VRS_DECLARED;
  ev->expression = nullptr;
  info->declarator.e = enm;
  info->ownedScope = currentScope;
  info->used = enm->isGlobal();
  declareSymbol(enm->name(), ev);

  for (auto &c : enm->consts()) {
    SymbolInfo *constInfo = makeSymbolInfo(SK_ENUM_CONST);
    ValueRef *cv = makeValueRef(constInfo);
    cv->state = VRS_INITIALIZED;
    cv->expression = c.val;
    constInfo->declarator.ec = &c;
    constInfo->ownedScope = currentScope;
    constInfo->used = enm->isGlobal();

    const SQChar *fqn = enumFqn(arena, enm->name(), c.id);
    declareSymbol(fqn, cv);

    c.val->visit(this);
  }
}